

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_0> *lhs,long depth,long rows,
            long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  double (*padVar3) [2];
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  Packet2d adVar4;
  long in_stack_00000008;
  long k_2;
  Packet A_1;
  long k_1;
  Packet B;
  Packet A;
  long k;
  long i;
  long peeled_mc0;
  long peeled_mc1;
  long peeled_mc2;
  long peeled_mc3;
  long count;
  conj_if<false> cj;
  long local_180;
  double local_178 [3];
  long local_160;
  double local_158 [2];
  double local_148 [3];
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  undefined8 local_108;
  long local_100;
  conj_if<false> local_f1;
  long local_f0;
  long local_e8;
  long local_e0;
  long *local_d8;
  long local_d0;
  long local_c0;
  long local_b8;
  long *local_b0;
  double *local_a8;
  long local_a0;
  long local_98;
  long *local_90;
  double *local_88;
  long local_80;
  long local_78;
  long *local_70;
  double *local_68;
  long local_60;
  long local_58;
  long *local_50;
  long local_48;
  long local_40;
  long *local_38;
  long local_30;
  long local_28;
  long *local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  local_f0 = in_R9;
  local_e8 = in_R8;
  local_e0 = in_RCX;
  local_d8 = in_RDX;
  local_d0 = in_RSI;
  ignore_unused_variable<long>(&local_f0);
  ignore_unused_variable<long>(&stack0x00000008);
  if ((local_f0 != 0) || (bVar1 = true, in_stack_00000008 != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    local_100 = 0;
    local_108 = 0;
    local_110 = local_e8 / 4 << 2;
    local_120 = local_e8 / 2 << 1;
    local_118 = local_120;
    for (local_128 = 0; local_128 < local_110; local_128 = local_128 + 4) {
      for (local_130 = 0; local_130 < local_e0; local_130 = local_130 + 1) {
        local_70 = local_d8;
        local_78 = local_128;
        local_80 = local_130;
        local_50 = local_d8;
        local_58 = local_128;
        local_60 = local_130;
        local_68 = (double *)(*local_d8 + (local_128 + local_130 * local_d8[1]) * 8);
        adVar4 = ploadu<double__vector(2)>(local_68);
        local_148[0] = adVar4[0];
        local_98 = local_128 + 2;
        local_90 = local_d8;
        local_a0 = local_130;
        local_38 = local_d8;
        local_48 = local_130;
        local_88 = (double *)(*local_d8 + (local_98 + local_130 * local_d8[1]) * 8);
        local_40 = local_98;
        adVar4 = ploadu<double__vector(2)>(local_88);
        local_158[0] = adVar4[0];
        pdVar2 = (double *)(local_d0 + local_100 * 8);
        padVar3 = conj_if<false>::pconj<double__vector(2)>(&local_f1,(double (*) [2])local_148);
        pstore<double,double__vector(2)>(pdVar2,padVar3);
        local_100 = local_100 + 2;
        pdVar2 = (double *)(local_d0 + local_100 * 8);
        padVar3 = conj_if<false>::pconj<double__vector(2)>(&local_f1,&local_158);
        pstore<double,double__vector(2)>(pdVar2,padVar3);
        local_100 = local_100 + 2;
      }
    }
    for (; local_128 < local_118; local_128 = local_128 + 2) {
      for (local_160 = 0; local_160 < local_e0; local_160 = local_160 + 1) {
        local_b0 = local_d8;
        local_b8 = local_128;
        local_c0 = local_160;
        local_20 = local_d8;
        local_28 = local_128;
        local_30 = local_160;
        local_a8 = (double *)(*local_d8 + (local_128 + local_160 * local_d8[1]) * 8);
        adVar4 = ploadu<double__vector(2)>(local_a8);
        local_178[0] = adVar4[0];
        pdVar2 = (double *)(local_d0 + local_100 * 8);
        padVar3 = conj_if<false>::pconj<double__vector(2)>(&local_f1,(double (*) [2])local_178);
        pstore<double,double__vector(2)>(pdVar2,padVar3);
        local_100 = local_100 + 2;
      }
    }
    for (; local_128 < local_e8; local_128 = local_128 + 1) {
      for (local_180 = 0; local_180 < local_e0; local_180 = local_180 + 1) {
        local_8 = local_d8;
        local_10 = local_128;
        local_18 = local_180;
        pdVar2 = conj_if<false>::operator()
                           (&local_f1,
                            (double *)(*local_d8 + (local_128 + local_180 * local_d8[1]) * 8));
        *(double *)(local_d0 + local_100 * 8) = *pdVar2;
        local_100 = local_100 + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x6b0,
                "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 2, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, Pack1 = 4, Pack2 = 2, StorageOrder = 0, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  eigen_assert( ((Pack1%PacketSize)==0 && Pack1<=4*PacketSize) || (Pack1<=4) );
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

  const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
  const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
  const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;
  const Index peeled_mc0 = Pack2>=1*PacketSize ? peeled_mc1
                         : Pack2>1             ? (rows/Pack2)*Pack2 : 0;

  Index i=0;

  // Pack 3 packets
  if(Pack1>=3*PacketSize)
  {
    for(; i<peeled_mc3; i+=3*PacketSize)
    {
      if(PanelMode) count += (3*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B, C;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        C = lhs.loadPacket(i+2*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(C)); count+=PacketSize;
      }
      if(PanelMode) count += (3*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 2 packets
  if(Pack1>=2*PacketSize)
  {
    for(; i<peeled_mc2; i+=2*PacketSize)
    {
      if(PanelMode) count += (2*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
      }
      if(PanelMode) count += (2*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 1 packets
  if(Pack1>=1*PacketSize)
  {
    for(; i<peeled_mc1; i+=1*PacketSize)
    {
      if(PanelMode) count += (1*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A;
        A = lhs.loadPacket(i+0*PacketSize, k);
        pstore(blockA+count, cj.pconj(A));
        count+=PacketSize;
      }
      if(PanelMode) count += (1*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack scalars
  if(Pack2<PacketSize && Pack2>1)
  {
    for(; i<peeled_mc0; i+=Pack2)
    {
      if(PanelMode) count += Pack2 * offset;

      for(Index k=0; k<depth; k++)
        for(Index w=0; w<Pack2; w++)
          blockA[count++] = cj(lhs(i+w, k));

      if(PanelMode) count += Pack2 * (stride-offset-depth);
    }
  }
  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}